

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_adj.cpp
# Opt level: O0

LOs __thiscall
Omega_h::find_unique(Omega_h *this,LOs *hv2v,Omega_h_Family family,Int high_dim,Int low_dim)

{
  char *file;
  void *extraout_RDX;
  LOs LVar1;
  Int local_228;
  Int local_218;
  Int local_20c;
  Int local_204;
  Int local_200;
  Int local_1fc;
  Int local_1ec;
  Int local_1e0;
  Int local_1d8;
  int local_1d0;
  int local_1c0;
  int local_1b4;
  int local_1ac;
  int local_1a8;
  int local_1a4;
  int local_194;
  int local_188;
  int local_180;
  Read<int> local_150;
  Int local_13c;
  undefined1 local_138 [4];
  Int deg;
  undefined1 local_128 [8];
  LOs uv2v;
  allocator local_e1;
  string local_e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0 [35];
  ScopedTimer local_7d;
  Int local_7c;
  Int IStack_78;
  ScopedTimer omega_h_scoped_function_timer;
  Int low_dim_local;
  Int high_dim_local;
  Omega_h_Family family_local;
  LOs *hv2v_local;
  ulong local_10;
  
  local_7c = low_dim;
  IStack_78 = high_dim;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_e0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_adj.cpp"
             ,&local_e1);
  std::operator+(local_c0,(char *)local_e0);
  std::__cxx11::to_string((__cxx11 *)&uv2v.write_.shared_alloc_.direct_ptr,0x92);
  std::operator+(local_a0,local_c0);
  file = (char *)std::__cxx11::string::c_str();
  ScopedTimer::ScopedTimer(&local_7d,"find_unique",file);
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string((string *)&uv2v.write_.shared_alloc_.direct_ptr);
  std::__cxx11::string::~string((string *)local_c0);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  if (IStack_78 <= local_7c) {
    fail("assertion %s failed at %s +%d\n","high_dim > low_dim",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_adj.cpp"
         ,0x93);
  }
  if (2 < local_7c) {
    fail("assertion %s failed at %s +%d\n","low_dim <= 2",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_adj.cpp"
         ,0x94);
  }
  if (((ulong)(hv2v->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((hv2v->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(hv2v->write_).shared_alloc_.alloc >> 3;
  }
  if (family == OMEGA_H_SIMPLEX) {
    if (IStack_78 == 0) {
      local_180 = 1;
    }
    else {
      if (IStack_78 == 1) {
        local_188 = 2;
      }
      else {
        if (IStack_78 == 2) {
          local_194 = 3;
        }
        else {
          if (IStack_78 == 3) {
            local_1a4 = 4;
          }
          else {
            local_1a4 = -1;
          }
          local_194 = local_1a4;
        }
        local_188 = local_194;
      }
      local_180 = local_188;
    }
    local_1a8 = local_180;
  }
  else {
    if (IStack_78 == 0) {
      local_1ac = 1;
    }
    else {
      if (IStack_78 == 1) {
        local_1b4 = 2;
      }
      else {
        if (IStack_78 == 2) {
          local_1c0 = 4;
        }
        else {
          if (IStack_78 == 3) {
            local_1d0 = 8;
          }
          else {
            local_1d0 = -1;
          }
          local_1c0 = local_1d0;
        }
        local_1b4 = local_1c0;
      }
      local_1ac = local_1b4;
    }
    local_1a8 = local_1ac;
  }
  if ((int)(local_10 >> 2) % local_1a8 != 0) {
    fail("assertion %s failed at %s +%d\n",
         "hv2v.size() % element_degree(family, high_dim, VERT) == 0",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_adj.cpp"
         ,0x95);
  }
  Read<int>::Read((Read<int> *)local_138,hv2v);
  form_uses((Omega_h *)local_128,(LOs *)local_138,family,IStack_78,local_7c);
  Read<int>::~Read((Read<int> *)local_138);
  if (family == OMEGA_H_SIMPLEX) {
    if (local_7c == 0) {
      local_1d8 = 1;
    }
    else {
      if (local_7c == 1) {
        local_1e0 = 2;
      }
      else {
        if (local_7c == 2) {
          local_1ec = 3;
        }
        else {
          if (local_7c == 3) {
            local_1fc = 4;
          }
          else {
            local_1fc = -1;
          }
          local_1ec = local_1fc;
        }
        local_1e0 = local_1ec;
      }
      local_1d8 = local_1e0;
    }
    local_200 = local_1d8;
  }
  else {
    if (local_7c == 0) {
      local_204 = 1;
    }
    else {
      if (local_7c == 1) {
        local_20c = 2;
      }
      else {
        if (local_7c == 2) {
          local_218 = 4;
        }
        else {
          if (local_7c == 3) {
            local_228 = 8;
          }
          else {
            local_228 = -1;
          }
          local_218 = local_228;
        }
        local_20c = local_218;
      }
      local_204 = local_20c;
    }
    local_200 = local_204;
  }
  local_13c = local_200;
  Read<int>::Read(&local_150,(Read<int> *)local_128);
  find_unique_deg(this,local_200,&local_150);
  Read<int>::~Read(&local_150);
  Read<int>::~Read((Read<int> *)local_128);
  ScopedTimer::~ScopedTimer(&local_7d);
  LVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  LVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (LOs)LVar1.write_.shared_alloc_;
}

Assistant:

LOs find_unique(LOs const hv2v, Omega_h_Family const family, Int const high_dim,
    Int const low_dim) {
  OMEGA_H_TIME_FUNCTION;
  OMEGA_H_CHECK(high_dim > low_dim);
  OMEGA_H_CHECK(low_dim <= 2);
  OMEGA_H_CHECK(hv2v.size() % element_degree(family, high_dim, VERT) == 0);
  auto const uv2v = form_uses(hv2v, family, high_dim, low_dim);
  auto const deg = element_degree(family, low_dim, VERT);
  return find_unique_deg(deg, uv2v);
}